

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_long,long>::
Flush<duckdb::BitpackingCompressionState<unsigned_long,true,long>::BitpackingWriter>
          (BitpackingState<unsigned_long,long> *this)

{
  unsigned_long *puVar1;
  long lVar2;
  unsigned_long *values;
  long lVar3;
  BitpackingState<unsigned_long,long> BVar4;
  unsigned_long uVar5;
  unsigned_long value_1;
  ulong uVar6;
  byte width;
  ulong uVar7;
  bool bVar8;
  unsigned_long value;
  byte bVar9;
  
  bVar8 = true;
  if (*(idx_t *)(this + 0x8810) != 0) {
    if (((this[0x8861] == (BitpackingState<unsigned_long,long>)0x0) &&
        (*(long *)(this + 0x8830) != *(long *)(this + 0x8828))) ||
       (1 < (byte)((char)this[0x8864] - 1U))) {
      BVar4 = (BitpackingState<unsigned_long,long>)
              TrySubtractOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                        (*(uint64_t *)(this + 0x8830),*(uint64_t *)(this + 0x8828),
                         (uint64_t *)(this + 0x8838));
      this[0x8863] = BVar4;
      BitpackingState<unsigned_long,_long>::CalculateDeltaStats
                ((BitpackingState<unsigned_long,_long> *)this);
      if (this[0x8862] == (BitpackingState<unsigned_long,long>)0x1) {
        lVar2 = *(long *)(this + 0x8840);
        if ((*(long *)(this + 0x8848) == lVar2) && (((byte)this[0x8864] & 0xfe) != 4)) {
          BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::
          WriteConstantDelta(*(long *)(this + 0x8848),**(unsigned_long **)(this + 0x4008),
                             *(idx_t *)(this + 0x8810),*(unsigned_long **)(this + 0x4008),
                             (bool *)(this + 0x8010),*(void **)(this + 0x8820));
          *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0x14;
          return true;
        }
        uVar7 = *(ulong *)(this + 0x8838);
        uVar6 = *(ulong *)(this + 0x8850);
        lVar3 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        bVar9 = 0x40 - ((byte)lVar3 ^ 0x3f);
        if (uVar6 >> 0x38 != 0) {
          bVar9 = 0x40;
        }
        width = 0;
        if (uVar6 != 0) {
          width = bVar9;
        }
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        bVar9 = 0x40 - ((byte)lVar3 ^ 0x3f);
        if (uVar7 >> 0x38 != 0) {
          bVar9 = 0x40;
        }
        BVar4 = this[0x8864];
        if ((BVar4 != (BitpackingState<unsigned_long,long>)0x5 && uVar7 != 0) && width < bVar9) {
          if (*(long *)(this + 0x8810) != 0) {
            uVar6 = 0;
            do {
              *(long *)(this + uVar6 * 8 + 0x4010) = *(long *)(this + uVar6 * 8 + 0x4010) - lVar2;
              uVar6 = uVar6 + 1;
            } while (uVar6 < *(ulong *)(this + 0x8810));
          }
          BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteDeltaFor
                    ((unsigned_long *)(this + 0x4010),(bool *)(this + 0x8010),width,
                     *(unsigned_long *)(this + 0x8840),*(long *)(this + 0x8858),
                     *(unsigned_long **)(this + 0x4008),*(idx_t *)(this + 0x8810),
                     *(void **)(this + 0x8820));
          *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0x18;
          uVar6 = *(ulong *)(this + 0x8810);
          if ((uVar6 & 0x1f) != 0) {
            uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar6 & 0x1f);
            uVar6 = (uVar6 - uVar5) + 0x20;
          }
          *(ulong *)(this + 0x8818) = *(long *)(this + 0x8818) + (width * uVar6 >> 3);
          if ((BVar4 != (BitpackingState<unsigned_long,long>)0x5 && uVar7 != 0) && width < bVar9) {
            return true;
          }
        }
      }
      bVar8 = false;
      if (this[0x8863] == (BitpackingState<unsigned_long,long>)0x1) {
        uVar7 = *(ulong *)(this + 0x8838);
        lVar2 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        bVar9 = 0x40;
        if (uVar7 >> 0x38 == 0) {
          bVar9 = 0x40 - ((byte)lVar2 ^ 0x3f);
        }
        if (uVar7 == 0) {
          bVar9 = 0;
        }
        values = *(unsigned_long **)(this + 0x4008);
        if (*(long *)(this + 0x8810) != 0) {
          lVar2 = *(long *)(this + 0x8828);
          uVar7 = 0;
          do {
            puVar1 = values + uVar7;
            *puVar1 = *puVar1 - lVar2;
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(ulong *)(this + 0x8810));
        }
        BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteFor
                  (values,(bool *)(this + 0x8010),bVar9,*(unsigned_long *)(this + 0x8828),
                   *(idx_t *)(this + 0x8810),*(void **)(this + 0x8820));
        uVar7 = *(ulong *)(this + 0x8810);
        if ((uVar7 & 0x1f) != 0) {
          uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar7 & 0x1f);
          uVar7 = (uVar7 - uVar5) + 0x20;
        }
        *(ulong *)(this + 0x8818) = *(long *)(this + 0x8818) + (bVar9 * uVar7 >> 3) + 0x10;
        bVar8 = true;
      }
    }
    else {
      BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteConstant
                (*(unsigned_long *)(this + 0x8830),*(idx_t *)(this + 0x8810),
                 *(void **)(this + 0x8820),(bool)this[0x8861]);
      *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0xc;
    }
  }
  return bVar8;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}